

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
duckdb::vector<duckdb::JoinCondition,_true>::erase_at
          (vector<duckdb::JoinCondition,_true> *this,idx_t idx)

{
  long lVar1;
  InternalException *this_00;
  allocator local_49;
  string local_48;
  
  lVar1 = (long)(this->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (idx <= (ulong)(lVar1 / 0x18)) {
    unsafe_erase_at(this,idx);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10,idx,lVar1 % 0x18);
  ::std::__cxx11::string::string
            ((string *)&local_48,"Can\'t remove offset %d from vector of size %d",&local_49);
  InternalException::InternalException<unsigned_long,unsigned_long>
            (this_00,&local_48,idx,
             ((long)(this->
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->
                   super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                   super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void erase_at(idx_t idx) { // NOLINT: not using camelcase on purpose here
		if (MemorySafety<SAFE>::ENABLED && idx > original::size()) {
			throw InternalException("Can't remove offset %d from vector of size %d", idx, original::size());
		}
		unsafe_erase_at(idx);
	}